

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall
smf::Binasc::readMidiEvent(Binasc *this,ostream *out,istream *infile,int *trackbytes,int *command)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint uVar8;
  long *plVar9;
  int key;
  int key_00;
  Binasc *pBVar10;
  uchar ch;
  string comment;
  stringstream output;
  byte local_235;
  uint local_234;
  Binasc *local_230;
  int local_224;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  ostream *local_200;
  char *local_1f8;
  long local_1f0;
  char local_1e8 [16];
  string local_1d8;
  stringstream local_1b8 [16];
  Binasc local_1a8;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_230 = this;
  local_200 = out;
  iVar3 = getVLV(this,infile,trackbytes);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"v",1);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_1a8,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
  local_1f8 = local_1e8;
  local_1f0 = 0;
  local_1e8[0] = '\0';
  std::istream::read((char *)infile,(long)&local_235);
  *trackbytes = *trackbytes + 1;
  if ((char)local_235 < '\0') {
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
    std::ostream::operator<<((ostream *)&local_1a8,(uint)local_235);
    *command = (uint)local_235;
    std::istream::read((char *)infile,(long)&local_235);
    *trackbytes = *trackbytes + 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"   ",3);
  }
  uVar4 = *command;
  uVar8 = (uVar4 & 0xf0) - 0x80 >> 4;
  local_224 = 1;
  if (7 < uVar8) goto LAB_00123f89;
  local_234 = (uint)(char)local_235;
  switch(uVar8) {
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,local_234);
    std::istream::read((char *)infile,(long)&local_235);
    *trackbytes = *trackbytes + 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,(int)(char)local_235);
    if (local_230->m_commentsQ != 0) {
      keyToPitchName_abi_cxx11_(&local_1d8,(Binasc *)(ulong)local_234,key);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x1295fc);
      local_220 = &local_210;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_210 = *plVar9;
        lStack_208 = plVar6[3];
      }
      else {
        local_210 = *plVar9;
        local_220 = (long *)*plVar6;
      }
      local_218 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_220);
LAB_0012435b:
      if (local_220 != &local_210) {
        operator_delete(local_220);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
    }
    break;
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,local_234);
    std::istream::read((char *)infile,(long)&local_235);
    *trackbytes = *trackbytes + 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,(int)(char)local_235);
    if (local_230->m_commentsQ != 0) {
      if (local_235 == 0) {
        keyToPitchName_abi_cxx11_(&local_1d8,(Binasc *)(ulong)local_234,key_00);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x1295fc);
        local_220 = &local_210;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_210 = *plVar6;
          lStack_208 = puVar7[3];
        }
        else {
          local_210 = *plVar6;
          local_220 = (long *)*puVar7;
        }
        local_218 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_220);
      }
      else {
        keyToPitchName_abi_cxx11_(&local_1d8,(Binasc *)(ulong)local_234,key_00);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x129606);
        local_220 = &local_210;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_210 = *plVar6;
          lStack_208 = puVar7[3];
        }
        else {
          local_210 = *plVar6;
          local_220 = (long *)*puVar7;
        }
        local_218 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_220);
      }
      goto LAB_0012435b;
    }
    break;
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,local_234);
    std::istream::read((char *)infile,(long)&local_235);
    *trackbytes = *trackbytes + 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,(int)(char)local_235);
    iVar3 = local_230->m_commentsQ;
    goto joined_r0x00123c55;
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,local_234);
    std::istream::read((char *)infile,(long)&local_235);
    *trackbytes = *trackbytes + 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,(int)(char)local_235);
    iVar3 = local_230->m_commentsQ;
joined_r0x00123c55:
    if (iVar3 != 0) {
LAB_00123f7f:
      std::__cxx11::string::append((char *)&local_1f8);
    }
    break;
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,local_234);
    if (local_230->m_commentsQ == 0) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\t",1);
    goto LAB_00123f7f;
  case 5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,local_234);
    iVar3 = local_230->m_commentsQ;
    goto joined_r0x00123f76;
  case 6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,local_234);
    std::istream::read((char *)infile,(long)&local_235);
    *trackbytes = *trackbytes + 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,(int)(char)local_235);
    iVar3 = local_230->m_commentsQ;
joined_r0x00123f76:
    if (iVar3 == 0) break;
    goto LAB_00123f7f;
  case 7:
    if (uVar4 != 0xff) {
      if (uVar4 == 0xfe) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error command not yet handled",0x1d);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
        std::ostream::put('\x18');
        local_224 = 0;
        std::ostream::flush();
        goto LAB_00123ff7;
      }
      if (uVar4 == 0xf7) {
        pBVar10 = (Binasc *)infile;
        std::istream::putback((char)infile);
        *trackbytes = *trackbytes + -1;
        iVar3 = getVLV(pBVar10,infile,trackbytes);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," v",2);
        *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
        std::ostream::operator<<((ostream *)&local_1a8,iVar3);
        if (0 < iVar3) {
          do {
            std::istream::read((char *)infile,(long)&local_235);
            *trackbytes = *trackbytes + 1;
            if (local_235 < 0x10) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," 0",2);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
            }
            *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)&local_1a8,(uint)local_235);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
      }
      break;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
    pBVar10 = &local_1a8;
    std::ostream::operator<<((ostream *)&local_1a8,local_234 & 0xff);
    iVar3 = getVLV(pBVar10,infile,trackbytes);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," v",2);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 2;
    std::ostream::operator<<((ostream *)&local_1a8,iVar3);
    if ((local_234 & 0xff) < 0x20) {
      if ((local_234 & 0xff) - 1 < 9) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \"",2);
        if (0 < iVar3) {
          do {
            std::istream::read((char *)infile,(long)&local_235);
            *trackbytes = *trackbytes + 1;
            local_220 = (long *)CONCAT71(local_220._1_7_,local_235);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,(char *)&local_220,1);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\"",1);
      }
      else {
        if ((char)local_234 != '\0') goto switchD_0012428f_caseD_52;
        std::istream::read((char *)infile,(long)&local_235);
        bVar1 = local_235;
        *trackbytes = *trackbytes + 1;
        std::istream::read((char *)infile,(long)&local_235);
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," 2\'",3);
        std::ostream::operator<<((ostream *)&local_1a8,(uint)CONCAT11(bVar1,local_235));
      }
      goto LAB_0012466f;
    }
    switch(local_234 & 0xff) {
    case 0x51:
      std::istream::read((char *)infile,(long)&local_235);
      bVar1 = local_235;
      *trackbytes = *trackbytes + 1;
      std::istream::read((char *)infile,(long)&local_235);
      bVar2 = local_235;
      *trackbytes = *trackbytes + 1;
      std::istream::read((char *)infile,(long)&local_235);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," t",2);
      std::ostream::_M_insert<double>
                ((1000000.0 / (double)((uint)bVar2 << 8 | (uint)bVar1 << 0x10 | (uint)local_235)) *
                 60.0);
      goto LAB_0012466f;
    case 0x52:
    case 0x53:
    case 0x55:
    case 0x56:
    case 0x57:
      goto switchD_0012428f_caseD_52;
    case 0x54:
      std::istream::read((char *)infile,(long)&local_235);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
      std::ostream::operator<<((ostream *)&local_1a8,(uint)local_235);
      std::istream::read((char *)infile,(long)&local_235);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
      std::ostream::operator<<((ostream *)&local_1a8,(uint)local_235);
      std::istream::read((char *)infile,(long)&local_235);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
      std::ostream::operator<<((ostream *)&local_1a8,(uint)local_235);
      std::istream::read((char *)infile,(long)&local_235);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
      std::ostream::operator<<((ostream *)&local_1a8,(uint)local_235);
      std::istream::read((char *)infile,(long)&local_235);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
      break;
    case 0x58:
      std::istream::read((char *)infile,(long)&local_235);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
      std::ostream::operator<<((ostream *)&local_1a8,(uint)local_235);
      std::istream::read((char *)infile,(long)&local_235);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
      std::ostream::operator<<((ostream *)&local_1a8,(uint)local_235);
      std::istream::read((char *)infile,(long)&local_235);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
      std::ostream::operator<<((ostream *)&local_1a8,(uint)local_235);
      std::istream::read((char *)infile,(long)&local_235);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
      break;
    case 0x59:
      std::istream::read((char *)infile,(long)&local_235);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
      std::ostream::operator<<((ostream *)&local_1a8,(uint)local_235);
      std::istream::read((char *)infile,(long)&local_235);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
      break;
    default:
      if ((local_234 & 0xff) - 0x20 < 2) {
        std::istream::read((char *)infile,(long)&local_235);
        *trackbytes = *trackbytes + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," \'",2);
        break;
      }
      goto switchD_0012428f_caseD_52;
    }
    std::ostream::operator<<((ostream *)&local_1a8,(uint)local_235);
LAB_0012466f:
    uVar4 = local_234 & 0xff;
    if ((local_234 & 0xff) < 0x21) {
      switch(uVar4) {
      case 0:
        break;
      case 1:
        break;
      case 2:
        break;
      case 3:
        break;
      case 4:
        break;
      case 5:
        break;
      case 6:
        break;
      case 7:
        break;
      case 8:
        break;
      case 9:
        break;
      default:
        if (uVar4 != 0x20) goto switchD_001246b7_caseD_52;
      }
    }
    else if ((local_234 & 0xff) < 0x51) {
      if (uVar4 != 0x21) {
        if (uVar4 == 0x2f) {
          local_224 = 0;
          std::__cxx11::string::append((char *)&local_1f8);
          break;
        }
        goto switchD_001246b7_caseD_52;
      }
    }
    else {
      switch(local_234 & 0xff) {
      case 0x51:
        break;
      case 0x52:
      case 0x53:
      case 0x55:
      case 0x56:
      case 0x57:
switchD_001246b7_caseD_52:
        break;
      case 0x54:
        break;
      case 0x58:
        break;
      case 0x59:
        break;
      default:
        if (uVar4 != 0x7f) goto switchD_001246b7_caseD_52;
      }
    }
    std::__cxx11::string::append((char *)&local_1f8);
  }
LAB_00123f89:
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>(local_200,(char *)local_220,local_218);
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if (local_230->m_commentsQ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_200,"\t; ",3);
    std::__ostream_insert<char,std::char_traits<char>>(local_200,local_1f8,local_1f0);
  }
LAB_00123ff7:
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_224;
switchD_0012428f_caseD_52:
  if (0 < iVar3) {
    do {
      std::istream::read((char *)infile,(long)&local_235);
      *trackbytes = *trackbytes + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
      if (local_235 < 0x10) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"0",1);
      }
      *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)&local_1a8,(uint)local_235);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  goto LAB_0012466f;
}

Assistant:

int Binasc::readMidiEvent(std::ostream& out, std::istream& infile,
		int& trackbytes, int& command) {

	// Read and print Variable Length Value for delta ticks
	int vlv = getVLV(infile, trackbytes);

	std::stringstream output;

	output << "v" << std::dec << vlv << "\t";

	std::string comment;

	int status = 1;
	uchar ch;
	char byte1, byte2;
	infile.read((char*)&ch, 1);
	trackbytes++;
	if (ch < 0x80) {
		// running status: command byte is previous one in data stream
		output << "   ";
	} else {
		// midi command byte
		output << std::hex << (int)ch;
		command = ch;
		infile.read((char*)&ch, 1);
		trackbytes++;
	}
	byte1 = ch;
	switch (command & 0xf0) {
		case 0x80:    // note-off: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "note-off " + keyToPitchName(byte1);
			}
			break;
		case 0x90:    // note-on: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				if (byte2 == 0) {
					comment += "note-off " + keyToPitchName(byte1);
				} else {
					comment += "note-on " + keyToPitchName(byte1);
				}
			}
			break;
		case 0xA0:    // aftertouch: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "after-touch";
			}
			break;
		case 0xB0:    // continuous controller: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "controller";
			}
			break;
		case 0xE0:    // pitch-bend: 2 bytes
			output << " '" << std::dec << (int)byte1;
			infile.read((char*)&ch, 1);
			trackbytes++;
			byte2 = ch;
			output << " '" << std::dec << (int)byte2;
			if (m_commentsQ) {
				comment += "pitch-bend";
			}
			break;
		case 0xC0:    // patch change: 1 bytes
			output << " '" << std::dec << (int)byte1;
			if (m_commentsQ) {
				output << "\t";
				comment += "patch-change";
			}
			break;
		case 0xD0:    // channel pressure: 1 bytes
			output << " '" << std::dec << (int)byte1;
			if (m_commentsQ) {
				comment += "channel pressure";
			}
			break;
		case 0xF0:    // various system bytes: variable bytes
			switch (command) {
				case 0xf0:
					break;
				case 0xf7:
					// Read the first byte which is either 0xf0 or 0xf7.
					// Then a VLV byte count for the number of bytes
					// that remain in the message will follow.
					// Then read that number of bytes.
					{
					infile.putback(byte1);
					trackbytes--;
					int length = getVLV(infile, trackbytes);
					output << " v" << std::dec << length;
					for (int i=0; i<length; i++) {
						infile.read((char*)&ch, 1);
						trackbytes++;
						if (ch < 0x10) {
						   output << " 0" << std::hex << (int)ch;
						} else {
						   output << " " << std::hex << (int)ch;
						}
					}
					}
					break;
				case 0xf1:
					break;
				case 0xf2:
					break;
				case 0xf3:
					break;
				case 0xf4:
					break;
				case 0xf5:
					break;
				case 0xf6:
					break;
				case 0xf8:
					break;
				case 0xf9:
					break;
				case 0xfa:
					break;
				case 0xfb:
					break;
				case 0xfc:
					break;
				case 0xfd:
					break;
				case 0xfe:
					std::cerr << "Error command not yet handled" << std::endl;
					return 0;
					break;
				case 0xff:  // meta message
					{
					int metatype = ch;
					output << " " << std::hex << metatype;
					int length = getVLV(infile, trackbytes);
					output << " v" << std::dec << length;
					switch (metatype) {

						case 0x00:  // sequence number
						   // display two-byte big-endian decimal value.
						   {
						   infile.read((char*)&ch, 1);
						   trackbytes++;
						   int number = ch;
						   infile.read((char*)&ch, 1);
						   trackbytes++;
						   number = (number << 8) | ch;
						   output << " 2'" << number;
						   }
						   break;

						case 0x20: // MIDI channel prefix
						case 0x21: // MIDI port
						   // display single-byte decimal number
						   infile.read((char*)&ch, 1);
						   trackbytes++;
						   output << " '" << (int)ch;
						   break;

						case 0x51: // Tempo
						    // display tempo as "t" word.
						    {
						    int number = 0;
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    number = (number << 8) | ch;
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    number = (number << 8) | ch;
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    number = (number << 8) | ch;
						    double tempo = 1000000.0 / number * 60.0;
						    output << " t" << tempo;
						    }
						    break;

						case 0x54: // SMPTE offset
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // hour
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // minutes
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // seconds
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // frames
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // subframes
						    break;

						case 0x58: // time signature
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // numerator
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // denominator power
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // clocks per beat
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // 32nd notes per beat
						    break;

						case 0x59: // key signature
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // accidentals
						    infile.read((char*)&ch, 1);
						    trackbytes++;
						    output << " '" << (int)ch;  // mode
						    break;

						case 0x01: // text
						case 0x02: // copyright
						case 0x03: // track name
						case 0x04: // instrument name
						case 0x05: // lyric
						case 0x06: // marker
						case 0x07: // cue point
						case 0x08: // program name
						case 0x09: // device name
						   output << " \"";
						   for (int i=0; i<length; i++) {
						      infile.read((char*)&ch, 1);
						      trackbytes++;
						      output << (char)ch;
						   }
						   output << "\"";
						   break;
						default:
						   for (int i=0; i<length; i++) {
						      infile.read((char*)&ch, 1);
						      trackbytes++;
						      output << " ";
						      if (ch < 0x10) {
						         output << "0";
						      }
						      output << std::hex << (int)ch;
						   }
					}
					switch (metatype) {
						case 0x00: comment += "sequence number";     break;
						case 0x01: comment += "text";                break;
						case 0x02: comment += "copyright notice";    break;
						case 0x03: comment += "track name";          break;
						case 0x04: comment += "instrument name";     break;
						case 0x05: comment += "lyric";               break;
						case 0x06: comment += "marker";              break;
						case 0x07: comment += "cue point";           break;
						case 0x08: comment += "program name";        break;
						case 0x09: comment += "device name";         break;
						case 0x20: comment += "MIDI channel prefix"; break;
						case 0x21: comment += "MIDI port";           break;
						case 0x51: comment += "tempo";               break;
						case 0x54: comment += "SMPTE offset";        break;
						case 0x58: comment += "time signature";      break;
						case 0x59: comment += "key signature";       break;
						case 0x7f: comment += "system exclusive";    break;
						case 0x2f:
						   status = 0;
						   comment += "end-of-track";
						   break;
						default:
						   comment += "meta-message";
					}
					}
					break;

			}
			break;
	}

	out << output.str();
	if (m_commentsQ) {
		out << "\t; " << comment;
	}

	return status;
}